

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trw.cpp
# Opt level: O1

double __thiscall libDAI::TRW::runTRW(TRW *this)

{
  double dVar1;
  undefined1 auVar2 [16];
  value vVar3;
  unsigned_long uVar4;
  size_t iI;
  bool bVar5;
  undefined1 auVar6 [16];
  pointer puVar7;
  pointer puVar8;
  int iVar9;
  ostream *poVar10;
  undefined4 extraout_var;
  long lVar11;
  undefined4 extraout_var_00;
  size_type __n;
  undefined4 extraout_var_01;
  ulong uVar12;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  iterator iVar13;
  pointer pTVar14;
  size_t t_2;
  long lVar15;
  pointer pVVar16;
  size_t t;
  ulong uVar17;
  undefined1 auVar18 [16];
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  vector<unsigned_long,_std::allocator<unsigned_long>_> edge_seq;
  Diffs diffs;
  Factor nb;
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> old_beliefs;
  double local_f0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_e8;
  clock_t local_c8;
  double local_c0;
  Diffs local_b8;
  Factor local_80;
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> local_48;
  
  if ((this->Props).verbose != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Starting ",9);
    (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[9])(&local_b8,this);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,
                         (char *)local_b8.super_vector<double,_std::allocator<double>_>.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_start,
                         (long)local_b8.super_vector<double,_std::allocator<double>_>.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_finish);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,":inner_loop ...",0xf);
    if ((pointer *)
        local_b8.super_vector<double,_std::allocator<double>_>.
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
        != &local_b8.super_vector<double,_std::allocator<double>_>.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
      operator_delete(local_b8.super_vector<double,_std::allocator<double>_>.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_b8.super_vector<double,_std::allocator<double>_>.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage + 1);
    }
  }
  if (2 < (this->Props).verbose) {
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
    std::ostream::put(-0x50);
    std::ostream::flush();
  }
  init_messages(this);
  local_c8 = toc();
  iVar9 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
  lVar11 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar9) + 0x28))
                     ((long *)CONCAT44(extraout_var,iVar9));
  Diffs::Diffs(&local_b8,lVar11,1.0);
  local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
  local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (unsigned_long *)0x0;
  local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
  local_48.super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar9 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
  __n = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar9) + 0x28))
                  ((long *)CONCAT44(extraout_var_00,iVar9));
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::reserve
            (&local_48,__n);
  uVar17 = 0;
  while( true ) {
    iVar9 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    uVar12 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar9) + 0x28))
                       ((long *)CONCAT44(extraout_var_01,iVar9));
    if (uVar12 <= uVar17) break;
    beliefV(&local_80,this,uVar17);
    std::vector<libDAI::TFactor<double>,std::allocator<libDAI::TFactor<double>>>::
    emplace_back<libDAI::TFactor<double>>
              ((vector<libDAI::TFactor<double>,std::allocator<libDAI::TFactor<double>>> *)&local_48,
               &local_80);
    if (local_80._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_80._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_80._p._p.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_80._p._p.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_80._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_80._vs._vars.
                      super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_80._vs._vars.
                            super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_80._vs._vars.
                            super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    uVar17 = uVar17 + 1;
  }
  local_f0 = extraout_XMM0_Qa;
  iVar9 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            (&local_e8,
             *(long *)(CONCAT44(extraout_var_02,iVar9) + 0x48) -
             *(long *)(CONCAT44(extraout_var_02,iVar9) + 0x40) >> 4);
  pVVar16 = (pointer)0x0;
  while (local_80._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
         super__Vector_impl_data._M_start = pVVar16,
        iVar9 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this)
        , pVVar16 < (pointer)(*(long *)(CONCAT44(extraout_var_03,iVar9) + 0x48) -
                              *(long *)(CONCAT44(extraout_var_03,iVar9) + 0x40) >> 4)) {
    if (local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_long,std::allocator<unsigned_long>>::
      _M_realloc_insert<unsigned_long_const&>
                ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_e8,
                 (iterator)
                 local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish,(unsigned_long *)&local_80);
    }
    else {
      *local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish =
           (unsigned_long)
           local_80._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    pVVar16 = (pointer)((long)&(local_80._vs._vars.
                                super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                _M_impl.super__Vector_impl_data._M_start)->_label + 1);
  }
  (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[0xd])(this);
  this->_iterations = 0;
  dVar19 = INFINITY;
  bVar5 = (this->Props).tol != INFINITY;
  if ((this->Props).maxiter != 0 && bVar5) {
    do {
      puVar8 = local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
      puVar7 = local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      vVar3 = (this->Props).updates.v;
      if (vVar3 == SEQRND) {
        if ((local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start !=
             local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish) &&
           (local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start + 1 !=
            local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish)) {
          lVar11 = 8;
          do {
            iVar9 = rand();
            lVar15 = (long)iVar9 % ((lVar11 >> 3) + 1);
            if (lVar11 != lVar15 * 8) {
              uVar4 = *(unsigned_long *)((long)puVar7 + lVar11);
              *(unsigned_long *)((long)puVar7 + lVar11) = puVar7[lVar15];
              puVar7[lVar15] = uVar4;
            }
            lVar15 = lVar11 + 8;
            lVar11 = lVar11 + 8;
          } while ((unsigned_long *)((long)puVar7 + lVar15) != puVar8);
        }
LAB_004da339:
        for (uVar17 = 0;
            iVar9 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])
                              (this),
            uVar17 < (ulong)(*(long *)(CONCAT44(extraout_var_05,iVar9) + 0x48) -
                             *(long *)(CONCAT44(extraout_var_05,iVar9) + 0x40) >> 4);
            uVar17 = uVar17 + 1) {
          iI = local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[uVar17];
          calcNewMessage(this,iI);
          updateMessage(this,iI);
        }
      }
      else {
        if (vVar3 != PARALL) goto LAB_004da339;
        for (uVar17 = 0;
            iVar9 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])
                              (this),
            uVar17 < (ulong)(*(long *)(CONCAT44(extraout_var_04,iVar9) + 0x48) -
                             *(long *)(CONCAT44(extraout_var_04,iVar9) + 0x40) >> 4);
            uVar17 = uVar17 + 1) {
          calcNewMessage(this,uVar17);
        }
        for (uVar17 = 0;
            iVar9 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])
                              (this),
            uVar17 < (ulong)(*(long *)(CONCAT44(extraout_var_06,iVar9) + 0x48) -
                             *(long *)(CONCAT44(extraout_var_06,iVar9) + 0x40) >> 4);
            uVar17 = uVar17 + 1) {
          updateMessage(this,uVar17);
        }
      }
      uVar17 = 0;
      while( true ) {
        iVar9 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this)
        ;
        uVar12 = (**(code **)(*(long *)CONCAT44(extraout_var_07,iVar9) + 0x28))
                           ((long *)CONCAT44(extraout_var_07,iVar9));
        if (uVar12 <= uVar17) break;
        beliefV(&local_80,this,uVar17);
        dVar19 = -1.0;
        if (local_80._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl
            .super__Vector_impl_data._M_finish !=
            local_80._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl
            .super__Vector_impl_data._M_start) {
          pTVar14 = local_48.
                    super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar17;
          dVar19 = -1.0;
          if ((pTVar14->_vs)._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
              _M_impl.super__Vector_impl_data._M_finish !=
              (pTVar14->_vs)._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
              _M_impl.super__Vector_impl_data._M_start) {
            if ((long)local_80._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_80._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start == 0) {
              dVar19 = 0.0;
            }
            else {
              lVar11 = (long)local_80._p._p.super__Vector_base<double,_std::allocator<double>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_80._p._p.super__Vector_base<double,_std::allocator<double>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 3;
              auVar18 = ZEXT816(0);
              lVar15 = 0;
              auVar23._8_8_ = 0x7fffffffffffffff;
              auVar23._0_8_ = 0x7fffffffffffffff;
              do {
                auVar22._8_8_ = 0;
                auVar22._0_8_ =
                     local_80._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar15] -
                     (pTVar14->_p)._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar15];
                auVar20 = vandpd_avx(auVar22,auVar23);
                auVar18 = vmaxsd_avx(auVar20,auVar18);
                dVar19 = auVar18._0_8_;
                lVar15 = lVar15 + 1;
              } while (lVar11 + (ulong)(lVar11 == 0) != lVar15);
            }
          }
        }
        Diffs::push(&local_b8,dVar19);
        TFactor<double>::operator=
                  (local_48.
                   super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar17,&local_80);
        if (local_80._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_80._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data._M_start,
                          (long)local_80._p._p.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_80._p._p.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_80._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl
            .super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_80._vs._vars.
                          super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_80._vs._vars.
                                super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_80._vs._vars.
                                super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        uVar17 = uVar17 + 1;
      }
      dVar19 = extraout_XMM0_Qa_00;
      (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[0xd])(this);
      local_c0 = dVar19;
      if (2 < (this->Props).verbose) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"TRW::runTRW:  maxdiff ",0x16);
        iVar13._M_current = &local_b8._def;
        if (local_b8._maxsize <=
            (ulong)((long)local_b8.super_vector<double,_std::allocator<double>_>.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)local_b8.super_vector<double,_std::allocator<double>_>.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start >> 3)) {
          iVar13._M_current = local_b8._maxpos._M_current;
        }
        poVar10 = std::ostream::_M_insert<double>(*iVar13._M_current);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,", logZ_diff ",0xc);
        auVar18._8_8_ = 0x7fffffffffffffff;
        auVar18._0_8_ = 0x7fffffffffffffff;
        auVar20._8_8_ = 0;
        auVar20._0_8_ = local_c0 - local_f0;
        auVar18 = vandpd_avx512vl(auVar20,auVar18);
        poVar10 = std::ostream::_M_insert<double>(auVar18._0_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10," after ",7);
        poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10," passes",7);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
        std::ostream::put((char)poVar10);
        std::ostream::flush();
      }
      iVar13._M_current = &local_b8._def;
      if (local_b8._maxsize <=
          (ulong)((long)local_b8.super_vector<double,_std::allocator<double>_>.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_b8.super_vector<double,_std::allocator<double>_>.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3)) {
        iVar13._M_current = local_b8._maxpos._M_current;
      }
      auVar6._8_8_ = 0x7fffffffffffffff;
      auVar6._0_8_ = 0x7fffffffffffffff;
      auVar21._8_8_ = 0;
      auVar21._0_8_ = local_c0 - local_f0;
      auVar18 = vandpd_avx512vl(auVar21,auVar6);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = *iVar13._M_current;
      auVar18 = vmaxsd_avx(auVar18,auVar2);
      dVar19 = auVar18._0_8_;
      uVar17 = this->_iterations + 1;
      this->_iterations = uVar17;
      dVar1 = (this->Props).tol;
      bVar5 = dVar1 < dVar19;
    } while ((uVar17 < (this->Props).maxiter) && (local_f0 = local_c0, dVar1 < dVar19));
  }
  if (this->_maxdiff < dVar19) {
    this->_maxdiff = dVar19;
  }
  uVar17 = (this->Props).verbose;
  if (uVar17 != 0) {
    if (bVar5) {
      if (uVar17 == 1) {
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
        std::ostream::put(-0x50);
        std::ostream::flush();
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"TRW::runTRW:  WARNING: not converged within ",0x2c);
      poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," passes (",9);
      toc();
      poVar10 = std::ostream::_M_insert<long>((long)poVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," clocks)...final maxdiff:",0x19);
      poVar10 = std::ostream::_M_insert<double>(dVar19);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    }
    else {
      if (2 < uVar17) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"TRW::runTRW:  ",0xe);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"converged in ",0xd);
      poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," passes (",9);
      toc();
      poVar10 = std::ostream::_M_insert<long>((long)poVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," clocks).",9);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    }
    std::ostream::put((char)poVar10);
    std::ostream::flush();
  }
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::~vector
            (&local_48);
  if (local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (unsigned_long *)0x0) {
    operator_delete(local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_b8.super_vector<double,_std::allocator<double>_>.
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      != (pointer)0x0) {
    operator_delete(local_b8.super_vector<double,_std::allocator<double>_>.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b8.super_vector<double,_std::allocator<double>_>.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.super_vector<double,_std::allocator<double>_>.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return dVar19;
}

Assistant:

double TRW::runTRW() {
        if( Props.verbose >= 1 )
            cout << "Starting " << identify() << ":inner_loop ...";
        if( Props.verbose >= 3)
           cout << endl; 

        init_messages();

        clock_t tic = toc();
        Diffs   diffs(grm().nrVars(), 1.0);
        
        vector<size_t> edge_seq;

        vector<Factor> old_beliefs;
        old_beliefs.reserve( grm().nrVars() );
        for( size_t i = 0; i < grm().nrVars(); i++ )
            old_beliefs.push_back(beliefV(i));

        edge_seq.reserve( grm().nrEdges() );
        for( size_t e = 0; e < grm().nrEdges(); e++ )
            edge_seq.push_back( e );

        double logZ_prev = INFINITY;
        double logZ_cur  = real(logZ());

        // do several passes over the network until maximum number of iterations has
        // been reached or until the maximum belief difference is smaller than tolerance
        // and logZ difference is smaller than tolerance
        double diff = INFINITY;
        for( _iterations = 0; _iterations < Props.maxiter && diff > Props.tol; _iterations++ ) {
            if( Props.updates == UpdateType::PARALL ) {
                // Parallel updates 
                for( size_t t = 0; t < grm().nrEdges(); t++ )
                    calcNewMessage(t);

                for( size_t t = 0; t < grm().nrEdges(); t++ )
                    updateMessage( t );
            } else {
                // Sequential updates
                if( Props.updates == UpdateType::SEQRND )
                    random_shuffle( edge_seq.begin(), edge_seq.end() );
                
                for( size_t t = 0; t < grm().nrEdges(); t++ ) {
                    size_t k = edge_seq[t];
                    calcNewMessage( k );
                    updateMessage( k );
                }
            }

            // calculate new beliefs and compare with old ones
            for( size_t i = 0; i < grm().nrVars(); i++ ) {
                Factor nb( beliefV(i) );
                diffs.push( dist( nb, old_beliefs[i], Prob::DISTLINF ) );
                old_beliefs[i] = nb;
            }
            logZ_prev = logZ_cur;
            logZ_cur  = real(logZ());

            if( Props.verbose >= 3 )
                cout << "TRW::runTRW:  maxdiff " << diffs.max() << ", logZ_diff " << fabs(logZ_cur - logZ_prev) << " after " << _iterations+1 << " passes" << endl;

            diff = diffs.max();
            if( fabs(logZ_cur - logZ_prev) > diff )
                diff = fabs(logZ_cur - logZ_prev);
        }

        if( diff > _maxdiff )
            _maxdiff = diff;

        if( Props.verbose >= 1 ) {
            if( diff > Props.tol ) {
                if( Props.verbose == 1 )
                    cout << endl;
                    cout << "TRW::runTRW:  WARNING: not converged within " << Props.maxiter << " passes (" << toc() - tic << " clocks)...final maxdiff:" << diff << endl;
            } else {
                if( Props.verbose >= 3 )
                    cout << "TRW::runTRW:  ";
                    cout << "converged in " << _iterations << " passes (" << toc() - tic << " clocks)." << endl;
            }
        }

        return diff;
    }